

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::EAMParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::EAMParameters> *this)

{
  SimpleTypeData<OpenMD::EAMParameters> *in_RDI;
  
  ~SimpleTypeData(in_RDI);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

SimpleTypeData(const std::string& id) :
        GenericData(id), data_(ElemDataType()) {}